

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btBridgedManifoldResult::addContactPoint
          (btBridgedManifoldResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar depth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btCollisionObject *pbVar4;
  btCollisionObjectWrapper *pbVar5;
  btCollisionObject *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  btScalar local_b0;
  btScalar bStack_ac;
  btScalar bStack_a8;
  btScalar bStack_a4;
  undefined1 local_a0 [16];
  btScalar local_90;
  btScalar bStack_8c;
  btScalar bStack_88;
  btScalar bStack_84;
  btScalar local_80;
  undefined8 local_7c;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_60;
  undefined1 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  
  pbVar5 = (this->super_btManifoldResult).m_body0Wrap;
  pbVar6 = pbVar5->m_collisionObject;
  fVar15 = (float)*(undefined8 *)pointInWorld->m_floats;
  fVar11 = depth * (float)*(undefined8 *)normalOnBInWorld->m_floats + fVar15;
  fVar13 = (float)((ulong)*(undefined8 *)pointInWorld->m_floats >> 0x20);
  fVar12 = depth * (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20) + fVar13;
  fVar14 = normalOnBInWorld->m_floats[2] * depth + pointInWorld->m_floats[2];
  if (((this->super_btManifoldResult).m_manifoldPtr)->m_body0 == pbVar6) {
    fVar19 = fVar12 - (pbVar6->m_worldTransform).m_origin.m_floats[1];
    fVar18 = fVar11 - (pbVar6->m_worldTransform).m_origin.m_floats[0];
    fVar20 = fVar14 - (pbVar6->m_worldTransform).m_origin.m_floats[2];
    uVar1 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[0].m_floats;
    uVar2 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[1].m_floats;
    uVar3 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar16 = fVar20 * (float)uVar3 + fVar18 * (float)uVar1 + fVar19 * (float)uVar2;
    fVar17 = fVar20 * (float)((ulong)uVar3 >> 0x20) +
             fVar18 * (float)((ulong)uVar1 >> 0x20) + fVar19 * (float)((ulong)uVar2 >> 0x20);
    fVar18 = fVar20 * (pbVar6->m_worldTransform).m_basis.m_el[2].m_floats[2] +
             fVar18 * (pbVar6->m_worldTransform).m_basis.m_el[0].m_floats[2] +
             fVar19 * (pbVar6->m_worldTransform).m_basis.m_el[1].m_floats[2];
    pbVar6 = ((this->super_btManifoldResult).m_body1Wrap)->m_collisionObject;
    lVar9 = 0x20;
    lVar7 = 0x24;
    lVar8 = 0x28;
    lVar10 = 0x2c;
  }
  else {
    pbVar5 = (this->super_btManifoldResult).m_body1Wrap;
    pbVar4 = pbVar5->m_collisionObject;
    fVar19 = fVar12 - (pbVar4->m_worldTransform).m_origin.m_floats[1];
    fVar18 = fVar11 - (pbVar4->m_worldTransform).m_origin.m_floats[0];
    fVar20 = fVar14 - (pbVar4->m_worldTransform).m_origin.m_floats[2];
    uVar1 = *(undefined8 *)(pbVar4->m_worldTransform).m_basis.m_el[0].m_floats;
    uVar2 = *(undefined8 *)(pbVar4->m_worldTransform).m_basis.m_el[1].m_floats;
    uVar3 = *(undefined8 *)(pbVar4->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar16 = fVar20 * (float)uVar3 + fVar18 * (float)uVar1 + fVar19 * (float)uVar2;
    fVar17 = fVar20 * (float)((ulong)uVar3 >> 0x20) +
             fVar18 * (float)((ulong)uVar1 >> 0x20) + fVar19 * (float)((ulong)uVar2 >> 0x20);
    fVar18 = fVar20 * (pbVar4->m_worldTransform).m_basis.m_el[2].m_floats[2] +
             fVar18 * (pbVar4->m_worldTransform).m_basis.m_el[0].m_floats[2] +
             fVar19 * (pbVar4->m_worldTransform).m_basis.m_el[1].m_floats[2];
    lVar9 = 0x24;
    lVar7 = 0x20;
    lVar8 = 0x2c;
    lVar10 = 0x28;
  }
  fVar15 = fVar15 - (pbVar6->m_worldTransform).m_origin.m_floats[0];
  fVar13 = fVar13 - (pbVar6->m_worldTransform).m_origin.m_floats[1];
  fVar19 = pointInWorld->m_floats[2] - (pbVar6->m_worldTransform).m_origin.m_floats[2];
  uVar1 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[0].m_floats;
  uVar2 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[1].m_floats;
  uVar3 = *(undefined8 *)(pbVar6->m_worldTransform).m_basis.m_el[2].m_floats;
  local_d0._4_4_ = fVar17;
  local_d0._0_4_ = fVar16;
  local_d0._8_4_ = fVar18;
  local_d0._12_4_ = 0;
  local_c0._4_4_ =
       fVar19 * (float)((ulong)uVar3 >> 0x20) +
       fVar15 * (float)((ulong)uVar1 >> 0x20) + fVar13 * (float)((ulong)uVar2 >> 0x20);
  local_c0._0_4_ = fVar19 * (float)uVar3 + fVar15 * (float)uVar1 + fVar13 * (float)uVar2;
  local_c0._8_4_ =
       fVar19 * (pbVar6->m_worldTransform).m_basis.m_el[2].m_floats[2] +
       fVar15 * (pbVar6->m_worldTransform).m_basis.m_el[0].m_floats[2] +
       fVar13 * (pbVar6->m_worldTransform).m_basis.m_el[1].m_floats[2];
  local_c0._12_4_ = 0;
  local_90 = normalOnBInWorld->m_floats[0];
  bStack_8c = normalOnBInWorld->m_floats[1];
  bStack_88 = normalOnBInWorld->m_floats[2];
  bStack_84 = normalOnBInWorld->m_floats[3];
  local_7c = 0;
  local_74 = 0;
  local_60 = 0;
  local_58 = 0;
  local_54 = 0;
  uStack_4c = 0;
  local_44 = 0;
  uStack_3c = 0;
  local_a0._4_4_ = fVar12;
  local_a0._0_4_ = fVar11;
  local_a0._8_4_ = fVar14;
  local_a0._12_4_ = 0;
  local_b0 = pointInWorld->m_floats[0];
  bStack_ac = pointInWorld->m_floats[1];
  bStack_a8 = pointInWorld->m_floats[2];
  bStack_a4 = pointInWorld->m_floats[3];
  local_64 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar10);
  local_68 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar8);
  local_6c = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar7);
  local_70 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar9);
  local_80 = depth;
  (**(code **)(*(long *)this->m_resultCallback + 0x18))(this->m_resultCallback,local_d0,pbVar5);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
	{
		bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
		btVector3 pointA = pointInWorld + normalOnBInWorld * depth;
		btVector3 localA;
		btVector3 localB;
		if (isSwapped)
		{
			localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		} else
		{
			localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		}
		
		btManifoldPoint newPt(localA,localB,normalOnBInWorld,depth);
		newPt.m_positionWorldOnA = pointA;
		newPt.m_positionWorldOnB = pointInWorld;
		
	   //BP mod, store contact triangles.
		if (isSwapped)
		{
			newPt.m_partId0 = m_partId1;
			newPt.m_partId1 = m_partId0;
			newPt.m_index0  = m_index1;
			newPt.m_index1  = m_index0;
		} else
		{
			newPt.m_partId0 = m_partId0;
			newPt.m_partId1 = m_partId1;
			newPt.m_index0  = m_index0;
			newPt.m_index1  = m_index1;
		}

		//experimental feature info, for per-triangle material etc.
		const btCollisionObjectWrapper* obj0Wrap = isSwapped? m_body1Wrap : m_body0Wrap;
		const btCollisionObjectWrapper* obj1Wrap = isSwapped? m_body0Wrap : m_body1Wrap;
		m_resultCallback.addSingleResult(newPt,obj0Wrap,newPt.m_partId0,newPt.m_index0,obj1Wrap,newPt.m_partId1,newPt.m_index1);

	}